

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool testing::internal::TuplePrefix<5ul>::
     Matches<std::tuple<testing::Matcher<int_const*>,testing::Matcher<unsigned_int>,testing::Matcher<void*>,testing::Matcher<unsigned_long*>,testing::Matcher<void_const*>,testing::Matcher<unsigned_long>>,std::tuple<int_const*,unsigned_int,void*,unsigned_long*,void_const*,unsigned_long>>
               (tuple<testing::Matcher<const_int_*>,_testing::Matcher<unsigned_int>,_testing::Matcher<void_*>,_testing::Matcher<unsigned_long_*>,_testing::Matcher<const_void_*>,_testing::Matcher<unsigned_long>_>
                *matcher_tuple,
               tuple<const_int_*,_unsigned_int,_void_*,_unsigned_long_*,_const_void_*,_unsigned_long>
               *value_tuple)

{
  bool bVar1;
  
  bVar1 = TuplePrefix<4ul>::
          Matches<std::tuple<testing::Matcher<int_const*>,testing::Matcher<unsigned_int>,testing::Matcher<void*>,testing::Matcher<unsigned_long*>,testing::Matcher<void_const*>,testing::Matcher<unsigned_long>>,std::tuple<int_const*,unsigned_int,void*,unsigned_long*,void_const*,unsigned_long>>
                    (matcher_tuple,value_tuple);
  if (bVar1) {
    bVar1 = MatcherBase<const_void_*>::Matches
                      ((MatcherBase<const_void_*> *)
                       &(matcher_tuple->
                        super__Tuple_impl<0UL,_testing::Matcher<const_int_*>,_testing::Matcher<unsigned_int>,_testing::Matcher<void_*>,_testing::Matcher<unsigned_long_*>,_testing::Matcher<const_void_*>,_testing::Matcher<unsigned_long>_>
                        ).
                        super__Tuple_impl<1UL,_testing::Matcher<unsigned_int>,_testing::Matcher<void_*>,_testing::Matcher<unsigned_long_*>,_testing::Matcher<const_void_*>,_testing::Matcher<unsigned_long>_>
                        .
                        super__Tuple_impl<2UL,_testing::Matcher<void_*>,_testing::Matcher<unsigned_long_*>,_testing::Matcher<const_void_*>,_testing::Matcher<unsigned_long>_>
                        .
                        super__Tuple_impl<3UL,_testing::Matcher<unsigned_long_*>,_testing::Matcher<const_void_*>,_testing::Matcher<unsigned_long>_>
                        .
                        super__Tuple_impl<4UL,_testing::Matcher<const_void_*>,_testing::Matcher<unsigned_long>_>
                        .super__Head_base<4UL,_testing::Matcher<const_void_*>,_false>,
                       &(value_tuple->
                        super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_void_*,_unsigned_long_*,_const_void_*,_unsigned_long>
                        ).
                        super__Tuple_impl<1UL,_unsigned_int,_void_*,_unsigned_long_*,_const_void_*,_unsigned_long>
                        .
                        super__Tuple_impl<2UL,_void_*,_unsigned_long_*,_const_void_*,_unsigned_long>
                        .super__Tuple_impl<3UL,_unsigned_long_*,_const_void_*,_unsigned_long>.
                        super__Tuple_impl<4UL,_const_void_*,_unsigned_long>.
                        super__Head_base<4UL,_const_void_*,_false>._M_head_impl);
    return bVar1;
  }
  return false;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple) &&
           std::get<N - 1>(matcher_tuple).Matches(std::get<N - 1>(value_tuple));
  }